

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  memory_buffer buf;
  parse_context local_268;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_250;
  buffer<char> local_230;
  char local_210 [504];
  
  local_230.size_ = 0;
  local_230._vptr_buffer = (_func_int **)&PTR_grow_00135cb8;
  local_230.capacity_ = 500;
  local_268.format_str_.data_ = (char *)0x0;
  local_268.format_str_.size_ = 0;
  local_268.next_arg_id_ = 0;
  local_250.out_.container = &local_230;
  local_250.args_.desc_ = 0;
  local_250.loc_.locale_ = (void *)0x0;
  local_230.ptr_ = local_210;
  (*h.custom_.format)(h.custom_.value,&local_268,&local_250);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_230.ptr_,local_230.ptr_ + local_230.size_);
  local_230._vptr_buffer = (_func_int **)&PTR_grow_00135cb8;
  if (local_230.ptr_ != local_210) {
    operator_delete(local_230.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    detail::buffer<char>& base = buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(std::back_inserter(base), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }